

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O3

void helics::CoreFactory::displayHelp(CoreType type)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<helics::CoreFactory::CoreBuilder> *psVar3;
  shared_ptr<helics::Core> core;
  long *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  long *local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_10;
  
  if ((type == UNRECOGNIZED) || (type == DEFAULT)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"All core types have similar options\n",0x24);
    psVar3 = MasterCoreBuilder::getIndexedBuilder(0);
    peVar1 = (psVar3->
             super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (**peVar1->_vptr_CoreBuilder)(&local_28,peVar1,0,0);
    (**(code **)(*local_28 + 0x10))(local_28,6,"--help");
    psVar3 = MasterCoreBuilder::getBuilder(0xb);
    peVar1 = (psVar3->
             super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (**peVar1->_vptr_CoreBuilder)(&local_18,peVar1,0,0);
    p_Var2 = p_Stack_10;
    local_28 = local_18;
    this = p_Stack_20;
    local_18 = (long *)0x0;
    p_Stack_10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Stack_20 = p_Var2;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      if (p_Stack_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_10);
      }
    }
    (**(code **)(*local_28 + 0x10))(local_28,6,"--help");
  }
  else {
    makeCore((CoreType)&local_28,(string_view)ZEXT416(type));
    (**(code **)(*local_28 + 0x10))(local_28,6,"--help");
  }
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  return;
}

Assistant:

void displayHelp(CoreType type)
{
    if (type == CoreType::DEFAULT || type == CoreType::UNRECOGNIZED) {
        std::cout << "All core types have similar options\n";
        auto core = makeCore(CoreType::DEFAULT, gHelicsEmptyString);
        core->configure(helpStr);
#ifdef HELICS_ENABLE_TCP_CORE
        core = makeCore(CoreType::TCP_SS, gHelicsEmptyString);
        core->configure(helpStr);
#endif
    } else {
        auto core = makeCore(type, gHelicsEmptyString);
        core->configure(helpStr);
    }
}